

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapCPPCommand.cxx
# Opt level: O3

bool cmQTWrapCPPCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  code **ppcVar1;
  cmMakefile *this;
  pointer pcVar2;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var3;
  bool bVar4;
  string *psVar5;
  cmSourceFile *this_00;
  string *psVar6;
  cmSourceFile *this_01;
  cmValue value;
  code **ppcVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  string_view value_00;
  __single_object cc;
  string hname;
  string sourceListValue;
  string newName;
  string srcName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_1b0;
  string local_1a8;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  size_type local_168;
  pointer local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  code **local_140;
  size_t local_138;
  code *local_130 [2];
  _Head_base<0UL,_cmCustomCommand_*,_false> local_120;
  string local_118;
  string local_f8;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string *local_a0;
  ulong local_98;
  string *local_90;
  string *local_88;
  string *local_80;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_78;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_98 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (code **)(local_188 + 0x10);
  local_188._0_8_ = ppcVar1;
  if (local_98 < 0x41) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_130[0] = (code *)local_178._0_8_;
    ppcVar7 = (code **)local_188._0_8_;
    if ((code **)local_188._0_8_ == ppcVar1) goto LAB_002b492b;
  }
  else {
    this = status->Makefile;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"QT_MOC_EXECUTABLE","");
    local_90 = cmMakefile::GetRequiredDefinition(this,(string *)local_188);
    if ((code **)local_188._0_8_ != ppcVar1) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_178._0_8_ + 1));
    }
    local_a0 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1;
    psVar5 = cmMakefile::GetSafeDefinition(this,local_a0);
    local_140 = local_130;
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar2,pcVar2 + psVar5->_M_string_length);
    local_80 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    psVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 2;
    if (psVar5 != local_80) {
      do {
        this_00 = cmMakefile::GetSource(this,psVar5,Ambiguous);
        if (this_00 == (cmSourceFile *)0x0) {
LAB_002b440d:
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_d8,psVar5);
          psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
          local_188._8_8_ = (psVar6->_M_dataplus)._M_p;
          local_188._0_8_ = psVar6->_M_string_length;
          local_178._0_8_ = 5;
          local_178._8_8_ = "/moc_";
          local_168 = local_d8._M_string_length;
          local_160 = local_d8._M_dataplus._M_p;
          local_158 = 4;
          local_150 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x7c8ced;
          views._M_len = 4;
          views._M_array = (iterator)local_188;
          cmCatViews_abi_cxx11_(&local_118,views);
          this_01 = cmMakefile::GetOrCreateSource(this,&local_118,true,Ambiguous);
          if (this_00 != (cmSourceFile *)0x0) {
            local_188._0_8_ = local_188 + 0x10;
            local_88 = psVar5;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"ABSTRACT","");
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"ABSTRACT","");
            value = cmSourceFile::GetProperty(this_00,&local_1a8);
            psVar5 = local_88;
            cmSourceFile::SetProperty(this_01,(string *)local_188,value);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,
                              CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                       local_1a8.field_2._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
              operator_delete((void *)local_188._0_8_,local_178._0_8_ + 1);
            }
          }
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          local_1a8._M_string_length = 0;
          local_1a8.field_2._M_local_buf[0] = '\0';
          bVar4 = cmsys::SystemTools::FileIsFullPath(psVar5);
          if (bVar4) {
            std::__cxx11::string::_M_assign((string *)&local_1a8);
          }
          else {
            if ((this_00 == (cmSourceFile *)0x0) ||
               (bVar4 = cmSourceFile::GetIsGenerated(this_00,GlobalAndLocal), !bVar4)) {
              cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
            }
            else {
              cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
            }
            std::__cxx11::string::_M_assign((string *)&local_1a8);
            std::__cxx11::string::append((char *)&local_1a8);
            std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)(psVar5->_M_dataplus)._M_p);
          }
          if (local_138 != 0) {
            std::__cxx11::string::append((char *)&local_140);
          }
          std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_118._M_dataplus._M_p);
          psVar6 = local_90;
          local_188._8_8_ = (local_90->_M_dataplus)._M_p;
          local_188._0_8_ = local_90->_M_string_length;
          local_178._0_8_ = 2;
          local_178._8_8_ = "-o";
          local_168 = local_118._M_string_length;
          local_160 = local_118._M_dataplus._M_p;
          local_158 = local_1a8._M_string_length;
          local_150 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1a8._M_dataplus._M_p;
          ilist._M_len = 4;
          ilist._M_array = (iterator)local_188;
          cmMakeSingleCommandLine((cmCustomCommandLines *)&local_78,ilist);
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_b8,psVar6);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_b8,&local_1a8);
          std::make_unique<cmCustomCommand>();
          _Var3._M_head_impl = local_1b0._M_head_impl;
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_118._M_dataplus._M_p,
                     local_118._M_dataplus._M_p + local_118._M_string_length);
          cmCustomCommand::SetOutputs(_Var3._M_head_impl,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          _Var3._M_head_impl = local_1b0._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&local_b8);
          cmCustomCommand::SetDepends(_Var3._M_head_impl,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          _Var3._M_head_impl = local_1b0._M_head_impl;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_60,&local_78);
          cmCustomCommand::SetCommandLines(_Var3._M_head_impl,(cmCustomCommandLines *)&local_60);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_60)
          ;
          cmCustomCommand::SetComment(local_1b0._M_head_impl,"Qt Wrapped File");
          local_120._M_head_impl = local_1b0._M_head_impl;
          local_1b0._M_head_impl = (cmCustomCommand *)0x0;
          local_178._0_8_ = (code *)0x0;
          local_178._8_8_ = 0;
          local_188._0_8_ = (code **)0x0;
          local_188._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (this,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                          &local_120,(CommandSourceCallback *)local_188,false);
          if ((code *)local_178._0_8_ != (code *)0x0) {
            (*(code *)local_178._0_8_)((string *)local_188,(string *)local_188,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_120);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_1b0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_b8);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_78)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                     local_1a8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_188._0_8_ = local_188 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"WRAP_EXCLUDE","");
          bVar4 = cmSourceFile::GetPropertyAsBool(this_00,(string *)local_188);
          if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
            operator_delete((void *)local_188._0_8_,(ulong)(local_178._0_8_ + 1));
          }
          if (!bVar4) goto LAB_002b440d;
        }
        psVar5 = psVar5 + 1;
      } while (psVar5 != local_80);
    }
    value_00._M_str = (char *)local_140;
    value_00._M_len = local_138;
    cmMakefile::AddDefinition(this,local_a0,value_00);
    ppcVar7 = local_140;
    if (local_140 == local_130) goto LAB_002b492b;
  }
  operator_delete(ppcVar7,(ulong)(local_130[0] + 1));
LAB_002b492b:
  return 0x40 < local_98;
}

Assistant:

bool cmQTWrapCPPCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the moc executable to run in the custom command.
  std::string const& moc_exe = mf.GetRequiredDefinition("QT_MOC_EXECUTABLE");

  // Get the variable holding the list of sources.
  std::string const& sourceList = args[1];
  std::string sourceListValue = mf.GetSafeDefinition(sourceList);

  // Create a rule for all sources listed.
  for (std::string const& arg : cmMakeRange(args).advance(2)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should wrap the class
    if (!(curr && curr->GetPropertyAsBool("WRAP_EXCLUDE"))) {
      // Compute the name of the file to generate.
      std::string srcName =
        cmSystemTools::GetFilenameWithoutLastExtension(arg);
      std::string newName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), "/moc_", srcName, ".cxx");
      cmSourceFile* sf = mf.GetOrCreateSource(newName, true);
      if (curr) {
        sf->SetProperty("ABSTRACT", curr->GetProperty("ABSTRACT"));
      }

      // Compute the name of the header from which to generate the file.
      std::string hname;
      if (cmSystemTools::FileIsFullPath(arg)) {
        hname = arg;
      } else {
        if (curr && curr->GetIsGenerated()) {
          hname = mf.GetCurrentBinaryDirectory();
        } else {
          hname = mf.GetCurrentSourceDirectory();
        }
        hname += "/";
        hname += arg;
      }

      // Append the generated source file to the list.
      if (!sourceListValue.empty()) {
        sourceListValue += ";";
      }
      sourceListValue += newName;

      // Create the custom command to generate the file.
      cmCustomCommandLines commandLines =
        cmMakeSingleCommandLine({ moc_exe, "-o", newName, hname });

      std::vector<std::string> depends;
      depends.push_back(moc_exe);
      depends.push_back(hname);

      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(newName);
      cc->SetDepends(depends);
      cc->SetCommandLines(commandLines);
      cc->SetComment("Qt Wrapped File");
      mf.AddCustomCommandToOutput(std::move(cc));
    }
  }

  // Store the final list of source files.
  mf.AddDefinition(sourceList, sourceListValue);
  return true;
}